

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O2

void __thiscall QDialog::done(QDialog *this,int r)

{
  QDialogPrivate *this_00;
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  QPointer<QDialog>::QPointer<void>((QPointer<QDialog> *)&local_38,this);
  this_00 = *(QDialogPrivate **)&(this->super_QWidget).field_0x8;
  QDialogPrivate::close(this_00,r);
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
  if (bVar1) {
    iVar2 = (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0xb0))(this_00);
    if (iVar2 == 0) {
      rejected(this);
    }
    else if (iVar2 == 1) {
      accepted(this);
    }
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
    if (bVar1) {
      finished(this,r);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialog::done(int r)
{
    QPointer<QDialog> guard(this);

    Q_D(QDialog);
    d->close(r);

    if (!guard)
        return;

    int dialogCode = d->dialogCode();
    if (dialogCode == QDialog::Accepted)
        emit accepted();
    else if (dialogCode == QDialog::Rejected)
        emit rejected();

    if (guard)
        emit finished(r);
}